

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontProvider.cpp
# Opt level: O0

bool __thiscall
Rml::FontProvider::AddFace
          (FontProvider *this,FontFaceHandleFreetype face,String *family,FontStyle style,
          FontWeight weight,bool fallback_face,UniquePtr<byte[]> *face_memory)

{
  uint8_t *this_00;
  undefined2 weight_00;
  undefined1 style_00;
  bool bVar1;
  ulong uVar2;
  pointer ppVar3;
  type this_01;
  FontFace *pFVar4;
  iterator iVar5;
  __normal_iterator<Rml::FontFace_**,_std::vector<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>_>
  local_e0;
  FontFace **local_d8;
  __normal_iterator<Rml::FontFace_**,_std::vector<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>_>
  local_d0;
  __normal_iterator<Rml::FontFace_**,_std::vector<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>_>
  local_c8;
  __normal_iterator<Rml::FontFace_**,_std::vector<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>_>
  it_fallback_face;
  FontFace *local_b8;
  FontFace *font_face_result;
  UniquePtr<Rml::FontFamily> font_family_ptr;
  undefined1 local_98 [8];
  iterator it;
  FontFamily *font_family;
  String local_70;
  undefined1 local_50 [8];
  String family_lower;
  bool fallback_face_local;
  FontWeight weight_local;
  FontStyle style_local;
  String *family_local;
  FontFaceHandleFreetype face_local;
  FontProvider *this_local;
  
  family_lower.field_2._M_local_buf[0xb] = fallback_face;
  family_lower.field_2._12_2_ = weight;
  family_lower.field_2._M_local_buf[0xf] = style;
  uVar2 = ::std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (family_lower.field_2._12_2_ != 0)) {
    ::std::__cxx11::string::string((string *)&local_70,(string *)family);
    StringUtilities::ToLower((String *)local_50,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    it.mInfo = (uint8_t *)0x0;
    iVar5 = robin_hood::detail::
            Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&this->font_families,(key_type *)local_50);
    it.mKeyVals = (NodePtr)iVar5.mInfo;
    local_98 = (undefined1  [8])iVar5.mKeyVals;
    iVar5 = robin_hood::detail::
            Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->font_families);
    font_family_ptr._M_t.
    super___uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>._M_t.
    super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>.
    super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl =
         (__uniq_ptr_data<Rml::FontFamily,_std::default_delete<Rml::FontFamily>,_true,_true>)
         iVar5.mKeyVals;
    bVar1 = robin_hood::detail::
            Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FontFamily,std::default_delete<Rml::FontFamily>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            ::Iter<false>::operator!=((Iter<false> *)local_98,(Iter<false> *)&font_family_ptr);
    if (bVar1) {
      ppVar3 = robin_hood::detail::
               Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::Iter<false>::operator->((Iter<false> *)local_98);
      it.mInfo = (uint8_t *)
                 ::std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>::get
                           (&ppVar3->second);
    }
    else {
      MakeUnique<Rml::FontFamily,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &font_face_result);
      it.mInfo = (uint8_t *)
                 ::std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>::get
                           ((unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_> *)
                            &font_face_result);
      this_01 = robin_hood::detail::
                Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FontFamily,std::default_delete<Rml::FontFamily>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                ::operator[]<std::unique_ptr<Rml::FontFamily,std::default_delete<Rml::FontFamily>>>
                          ((Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FontFamily,std::default_delete<Rml::FontFamily>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                            *)this,(key_type *)local_50);
      ::std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>::operator=
                (this_01,(unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_> *)
                         &font_face_result);
      ::std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>::~unique_ptr
                ((unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_> *)
                 &font_face_result);
    }
    style_00 = family_lower.field_2._M_local_buf[0xf];
    weight_00 = family_lower.field_2._12_2_;
    this_00 = it.mInfo;
    ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
               &it_fallback_face,face_memory);
    pFVar4 = FontFamily::AddFace((FontFamily *)this_00,face,style_00,weight_00,
                                 (UniquePtr<byte[]> *)&it_fallback_face);
    ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
               &it_fallback_face);
    local_b8 = pFVar4;
    if ((pFVar4 != (FontFace *)0x0) && ((family_lower.field_2._M_local_buf[0xb] & 1U) != 0)) {
      local_d0._M_current =
           (FontFace **)
           ::std::vector<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>::begin
                     (&this->fallback_font_faces);
      local_d8 = (FontFace **)
                 ::std::vector<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>::end
                           (&this->fallback_font_faces);
      local_c8 = ::std::
                 find<__gnu_cxx::__normal_iterator<Rml::FontFace**,std::vector<Rml::FontFace*,std::allocator<Rml::FontFace*>>>,Rml::FontFace*>
                           (local_d0,(__normal_iterator<Rml::FontFace_**,_std::vector<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>_>
                                      )local_d8,&local_b8);
      local_e0._M_current =
           (FontFace **)
           ::std::vector<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>::end
                     (&this->fallback_font_faces);
      bVar1 = __gnu_cxx::operator==(&local_c8,&local_e0);
      if (bVar1) {
        ::std::vector<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>::push_back
                  (&this->fallback_font_faces,&local_b8);
      }
    }
    this_local._7_1_ = local_b8 != (FontFace *)0x0;
    ::std::__cxx11::string::~string((string *)local_50);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FontProvider::AddFace(FontFaceHandleFreetype face, const String& family, Style::FontStyle style, Style::FontWeight weight, bool fallback_face,
	UniquePtr<byte[]> face_memory)
{
	if (family.empty() || weight == Style::FontWeight::Auto)
		return false;

	String family_lower = StringUtilities::ToLower(family);
	FontFamily* font_family = nullptr;
	auto it = font_families.find(family_lower);
	if (it != font_families.end())
	{
		font_family = (FontFamily*)it->second.get();
	}
	else
	{
		auto font_family_ptr = MakeUnique<FontFamily>(family_lower);
		font_family = font_family_ptr.get();
		font_families[family_lower] = std::move(font_family_ptr);
	}

	FontFace* font_face_result = font_family->AddFace(face, style, weight, std::move(face_memory));

	if (font_face_result && fallback_face)
	{
		auto it_fallback_face = std::find(fallback_font_faces.begin(), fallback_font_faces.end(), font_face_result);
		if (it_fallback_face == fallback_font_faces.end())
		{
			fallback_font_faces.push_back(font_face_result);
		}
	}

	return static_cast<bool>(font_face_result);
}